

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O3

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexStdLayoutOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  GMM_TILE_MODE GVar1;
  uint uVar2;
  anon_struct_8_44_94931171_for_Info aVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  GMM_PLATFORM_INFO *pGVar9;
  undefined4 extraout_var;
  ulong uVar10;
  ulong uVar11;
  uint32_t *puVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  GMM_GFX_SIZE_T GVar18;
  uint uVar19;
  long lVar20;
  uint32_t local_7c;
  uint32_t local_78;
  anon_struct_12_3_eb34d150 Element;
  GMM_GFX_SIZE_T local_60;
  uint local_38;
  
  GVar18 = (pReqInfo->StdLayout).Offset;
  puVar12 = &pReqInfo->ArrayIndex;
  if (GVar18 == 0xffffffffffffffff) {
    puVar12 = &pTexInfo->ArraySize;
  }
  uVar16 = ((uint)(pTexInfo->Type == RESOURCE_CUBE) * 5 + 1) * *puVar12;
  aVar3 = (pTexInfo->Flags).Info;
  iVar4 = 0x10000;
  if (((ulong)aVar3 & 0x104000000000) == 0) {
    iVar4 = (uint)(((ulong)aVar3 & 0x81000000000) != 0) << 0xc;
  }
  pGVar9 = GmmGetPlatformInfo(this->pGmmLibContext);
  uVar5 = pTexInfo->BitsPerPixel;
  GVar1 = pTexInfo->TileMode;
  GetCompressionBlockDimensions(this,pTexInfo->Format,&local_7c,&local_78,&Element.Width);
  uVar5 = (pGVar9->TileInfo[GVar1].LogicalTileWidth / (uVar5 >> 3)) * local_7c;
  uVar14 = local_78 * pGVar9->TileInfo[GVar1].LogicalTileHeight;
  uVar15 = Element.Width * pGVar9->TileInfo[GVar1].LogicalTileDepth;
  if (uVar16 == 0) {
    local_38 = pReqInfo->MipLevel;
  }
  else {
    local_38 = (pTexInfo->Alignment).MipTailStartLod;
    if (pTexInfo->MaxLod < local_38) {
      local_38 = pTexInfo->MaxLod;
    }
  }
  (pReqInfo->StdLayout).Offset = 0;
  local_60 = 0;
  lVar13 = 0;
  lVar20 = 0;
  uVar11 = 0;
  Element._4_8_ = (ulong)uVar5;
  do {
    uVar19 = (uint)uVar11;
    iVar6 = (*this->_vptr_GmmTextureCalc[0x18])(this,pTexInfo,uVar11);
    uVar10 = CONCAT44(extraout_var,iVar6);
    uVar7 = (*this->_vptr_GmmTextureCalc[0x19])(this,pTexInfo,uVar11);
    uVar8 = (*this->_vptr_GmmTextureCalc[0x1a])(this,pTexInfo,uVar11);
    if (Element.Height != 0) {
      uVar10 = (uVar10 + (uVar5 - 1)) / (ulong)uVar5;
    }
    if (uVar14 != 0) {
      uVar7 = (uVar7 + (uVar14 - 1)) / uVar14;
    }
    if (uVar15 != 0) {
      uVar8 = (uVar8 + (uVar15 - 1)) / uVar15;
    }
    if (uVar19 <= (pTexInfo->Alignment).MipTailStartLod) {
      (pReqInfo->StdLayout).Offset = (pReqInfo->StdLayout).Offset + lVar13;
    }
    uVar17 = (int)uVar10 * iVar4;
    uVar2 = pReqInfo->MipLevel;
    uVar11 = (ulong)(uVar7 * uVar17);
    if (uVar19 == uVar2) {
      local_60 = (pReqInfo->StdLayout).Offset;
      (pReqInfo->StdLayout).TileRowPitch = (ulong)uVar17;
      (pReqInfo->StdLayout).TileDepthPitch = uVar11;
    }
    lVar13 = uVar8 * uVar11;
    lVar20 = lVar20 + uVar11;
    uVar11 = (ulong)(uVar19 + 1);
  } while (uVar19 + 1 <= local_38);
  uVar5 = pReqInfo->Slice;
  if (GVar18 == 0xffffffffffffffff) {
    GVar18 = (pReqInfo->StdLayout).Offset;
  }
  else {
    GVar18 = (pReqInfo->StdLayout).Offset;
    if ((pTexInfo->Alignment).MipTailStartLod <= uVar2) {
      uVar14 = (*this->_vptr_GmmTextureCalc[9])();
      lVar13 = (ulong)uVar14 + (GVar18 + lVar13) * (ulong)uVar16 + (pReqInfo->StdLayout).Offset;
      goto LAB_001af938;
    }
  }
  lVar13 = (GVar18 + lVar13) * (ulong)uVar16 + local_60;
LAB_001af938:
  lVar20 = lVar20 * (ulong)uVar5;
  if ((ulong)uVar5 == 0) {
    lVar20 = 0;
  }
  (pReqInfo->StdLayout).Offset = lVar20 + lVar13;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexStdLayoutOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                         GMM_REQ_OFFSET_INFO *pReqInfo)
{
    uint32_t ReqArrayIndex;
    bool     NeedSurfaceSize = false;

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(GMM_IS_64KB_TILE(pTexInfo->Flags) || pTexInfo->Flags.Info.TiledYf);
    __GMM_ASSERT(
    (pTexInfo->Type == RESOURCE_2D) ||
    (pTexInfo->Type == RESOURCE_3D) ||
    (pTexInfo->Type == RESOURCE_CUBE));
    __GMM_ASSERT(GmmIsPlanar(pTexInfo->Format) == false); // Planar not support

    if(pReqInfo->StdLayout.Offset == -1) // Special Req for Surface Size
    {
        NeedSurfaceSize = true;
        ReqArrayIndex   = // TODO(Medium): Add planar support.
        (pTexInfo->ArraySize * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }
    else
    {
        ReqArrayIndex =
        (pReqInfo->ArrayIndex * ((pTexInfo->Type == RESOURCE_CUBE) ? 6 : 1));
    }

    {
        uint32_t TileSize = 0;

        // TileYs (64) and TileYf (4)
        if(GMM_IS_64KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(64);
        }
        else if(GMM_IS_4KB_TILE(pTexInfo->Flags))
        {
            TileSize = GMM_KBYTE(4);
        }

        const GMM_PLATFORM_INFO *pPlatform       = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
        uint32_t                 BytesPerElement = pTexInfo->BitsPerPixel / CHAR_BIT;
        GMM_TILE_MODE            TileMode        = pTexInfo->TileMode;
        struct
        {
            uint32_t Width, Height, Depth;
        } Element, Tile;

        __GMM_ASSERT(TileMode < GMM_TILE_MODES);

        GetCompressionBlockDimensions(
        pTexInfo->Format,
        &Element.Width,
        &Element.Height,
        &Element.Depth);

        Tile.Width =
        (pPlatform->TileInfo[TileMode].LogicalTileWidth / BytesPerElement) *
        Element.Width;

        Tile.Height =
        pPlatform->TileInfo[TileMode].LogicalTileHeight *
        Element.Height;

        Tile.Depth =
        pPlatform->TileInfo[TileMode].LogicalTileDepth *
        Element.Depth;

        {
            GMM_GFX_ADDRESS TargetLodOffset = 0;
            GMM_GFX_SIZE_T  PrevMipSize     = 0;
            GMM_GFX_SIZE_T  SliceOffset     = 0;
            GMM_GFX_SIZE_T  SlicePitch      = 0;
            uint32_t        Lod;
            uint32_t        EffectiveMaxLod =
            (ReqArrayIndex == 0) ?
            pReqInfo->MipLevel :
            GFX_MIN(pTexInfo->MaxLod, pTexInfo->Alignment.MipTailStartLod);

            pReqInfo->StdLayout.Offset = 0;
            for(Lod = 0; Lod <= EffectiveMaxLod; Lod++)
            {
                GMM_GFX_SIZE_T MipWidth  = GmmTexGetMipWidth(pTexInfo, Lod);
                uint32_t       MipHeight = GmmTexGetMipHeight(pTexInfo, Lod);
                uint32_t       MipDepth  = GmmTexGetMipDepth(pTexInfo, Lod);

                uint32_t MipCols = GFX_ULONG_CAST(
                GFX_CEIL_DIV(
                MipWidth,
                Tile.Width));
                uint32_t MipRows =
                GFX_CEIL_DIV(
                MipHeight,
                Tile.Height);
                uint32_t MipDepthTiles =
                GFX_CEIL_DIV(
                MipDepth,
                Tile.Depth);
                uint32_t RowPitch   = MipCols * TileSize; // Bytes from one tile row to the next.
                uint32_t DepthPitch = RowPitch * MipRows; // Bytes from one depth slice of tiles to the next.

                if(Lod <= pTexInfo->Alignment.MipTailStartLod)
                {
                    pReqInfo->StdLayout.Offset += PrevMipSize;
                }

                if(Lod == pReqInfo->MipLevel)
                {
                    TargetLodOffset = pReqInfo->StdLayout.Offset;

                    pReqInfo->StdLayout.TileRowPitch   = RowPitch;
                    pReqInfo->StdLayout.TileDepthPitch = DepthPitch;
                }

                PrevMipSize = (GMM_GFX_SIZE_T)DepthPitch * MipDepthTiles;
                SlicePitch += DepthPitch;
            }

            if(pReqInfo->Slice > 0)
            {
                SliceOffset = SlicePitch * pReqInfo->Slice;
            }

            if(!NeedSurfaceSize && pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod)
            {
                pReqInfo->StdLayout.Offset += (ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize)) +
                                              GetMipTailByteOffset(pTexInfo, pReqInfo->MipLevel);
            }
            else
            {
                pReqInfo->StdLayout.Offset = ReqArrayIndex * (pReqInfo->StdLayout.Offset + PrevMipSize) +
                                             TargetLodOffset;
            }

            pReqInfo->StdLayout.Offset += SliceOffset;
        }
    }

    return GMM_SUCCESS;
}